

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-objdump.cc
# Opt level: O3

Result dump_file(char *filename)

{
  uint8_t *data;
  Result RVar1;
  Result RVar2;
  wabt *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RCX;
  Enum EVar3;
  size_t size;
  bool bVar4;
  string_view filename_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  ObjdumpState state;
  uint8_t *local_248;
  long lStack_240;
  long local_238;
  ObjdumpState local_228;
  
  local_248 = (uint8_t *)0x0;
  lStack_240 = 0;
  local_238 = 0;
  this = (wabt *)strlen(filename);
  filename_00._M_str = (char *)&local_248;
  filename_00._M_len = (size_t)filename;
  RVar1 = wabt::ReadFile(this,filename_00,in_RCX);
  data = local_248;
  EVar3 = Error;
  if (RVar1.enum_ != Error) {
    size = lStack_240 - (long)local_248;
    s_objdump_options.filename = filename;
    putchar(10);
    local_228.type_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_228.type_names.names._M_t._M_impl.super__Rb_tree_header._M_header;
    local_228.type_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_228.type_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    local_228.code_relocations.super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_228.code_relocations.super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_228.code_relocations.super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_228.data_relocations.super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_228.data_relocations.super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_228.data_relocations.super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_228.type_names.names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_228.function_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_228.function_names.names._M_t._M_impl.super__Rb_tree_header._M_header;
    local_228.function_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_228.function_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    local_228.function_names.names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_228.global_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_228.global_names.names._M_t._M_impl.super__Rb_tree_header._M_header;
    local_228.global_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_228.global_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    local_228.global_names.names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_228.section_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_228.section_names.names._M_t._M_impl.super__Rb_tree_header._M_header;
    local_228.section_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_228.section_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    local_228.section_names.names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_228.tag_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_228.tag_names.names._M_t._M_impl.super__Rb_tree_header._M_header;
    local_228.tag_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_228.tag_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    local_228.tag_names.names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_228.segment_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_228.segment_names.names._M_t._M_impl.super__Rb_tree_header._M_header;
    local_228.segment_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_228.segment_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    local_228.segment_names.names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_228.table_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_228.table_names.names._M_t._M_impl.super__Rb_tree_header._M_header;
    local_228.table_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_228.table_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    local_228.table_names.names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_228.local_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_228.local_names.names._M_t._M_impl.super__Rb_tree_header._M_header;
    local_228.local_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_228.local_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    local_228.function_param_counts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_228.function_param_counts._M_t._M_impl.super__Rb_tree_header._M_header;
    local_228.function_param_counts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_228.function_param_counts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    local_228.symtab.super__Vector_base<wabt::ObjdumpSymbol,_std::allocator<wabt::ObjdumpSymbol>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_228.symtab.super__Vector_base<wabt::ObjdumpSymbol,_std::allocator<wabt::ObjdumpSymbol>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_228.local_names.names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_228.symtab.super__Vector_base<wabt::ObjdumpSymbol,_std::allocator<wabt::ObjdumpSymbol>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_228.function_param_counts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    s_objdump_options.mode = Prepass;
    local_228.type_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_228.type_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_228.function_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_228.function_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_228.global_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_228.global_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_228.section_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_228.section_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_228.tag_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_228.tag_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_228.segment_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_228.segment_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_228.table_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_228.table_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_228.local_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_228.local_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_228.function_param_counts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_228.function_param_counts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    RVar1 = wabt::ReadBinaryObjdump(data,size,&s_objdump_options,&local_228);
    bVar4 = RVar1.enum_ == Error;
    s_objdump_options.log_stream = (Stream *)0x0;
    if (s_objdump_options.headers == true) {
      s_objdump_options.mode = Headers;
      RVar2 = wabt::ReadBinaryObjdump(data,size,&s_objdump_options,&local_228);
      bVar4 = RVar2.enum_ == Error || RVar1.enum_ == Error;
    }
    if (s_objdump_options.details == true) {
      s_objdump_options.mode = Details;
      RVar1 = wabt::ReadBinaryObjdump(data,size,&s_objdump_options,&local_228);
      bVar4 = (bool)(bVar4 | RVar1.enum_ == Error);
    }
    if (s_objdump_options.disassemble == true) {
      s_objdump_options.mode = Disassemble;
      RVar1 = wabt::ReadBinaryObjdump(data,size,&s_objdump_options,&local_228);
      bVar4 = (bool)(bVar4 | RVar1.enum_ == Error);
    }
    if (s_objdump_options.raw == true) {
      s_objdump_options.mode = RawData;
      RVar1 = wabt::ReadBinaryObjdump(data,size,&s_objdump_options,&local_228);
      bVar4 = (bool)(bVar4 | RVar1.enum_ == Error);
    }
    EVar3 = (Enum)bVar4;
    wabt::ObjdumpState::~ObjdumpState(&local_228);
  }
  if (local_248 != (uint8_t *)0x0) {
    operator_delete(local_248,local_238 - (long)local_248);
  }
  return (Result)EVar3;
}

Assistant:

Result dump_file(const char* filename) {
  std::vector<uint8_t> file_data;
  CHECK_RESULT(ReadFile(filename, &file_data));

  uint8_t* data = file_data.data();
  size_t size = file_data.size();

  // Perform serveral passed over the binary in order to print out different
  // types of information.
  s_objdump_options.filename = filename;
  printf("\n");

  ObjdumpState state;

  Result result = Result::Ok;

  // Pass 0: Prepass
  s_objdump_options.mode = ObjdumpMode::Prepass;
  result |= ReadBinaryObjdump(data, size, &s_objdump_options, &state);
  s_objdump_options.log_stream = nullptr;

  // Pass 1: Print the section headers
  if (s_objdump_options.headers) {
    s_objdump_options.mode = ObjdumpMode::Headers;
    result |= ReadBinaryObjdump(data, size, &s_objdump_options, &state);
  }

  // Pass 2: Print extra information based on section type
  if (s_objdump_options.details) {
    s_objdump_options.mode = ObjdumpMode::Details;
    result |= ReadBinaryObjdump(data, size, &s_objdump_options, &state);
  }

  // Pass 3: Disassemble code section
  if (s_objdump_options.disassemble) {
    s_objdump_options.mode = ObjdumpMode::Disassemble;
    result |= ReadBinaryObjdump(data, size, &s_objdump_options, &state);
  }

  // Pass 4: Dump to raw contents of the sections
  if (s_objdump_options.raw) {
    s_objdump_options.mode = ObjdumpMode::RawData;
    result |= ReadBinaryObjdump(data, size, &s_objdump_options, &state);
  }

  return result;
}